

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_line_contains(MD_CTX *ctx,MD_OFFSET beg,MD_CHAR *what,MD_SIZE what_len,MD_OFFSET *p_end)

{
  char cVar1;
  uint uVar2;
  MD_CHAR *pMVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = ctx->size;
  iVar4 = 0;
  uVar5 = beg;
  if (beg + what_len < uVar2) {
    pMVar3 = ctx->text;
    do {
      cVar1 = pMVar3[beg];
      uVar5 = beg;
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
      iVar4 = bcmp(pMVar3 + beg,what,(ulong)what_len);
      if (iVar4 == 0) {
        uVar5 = what_len + beg;
        iVar4 = 1;
        goto LAB_005c951a;
      }
      iVar4 = what_len + beg;
      beg = beg + 1;
      uVar5 = uVar2 - what_len;
    } while (iVar4 + 1U < uVar2);
    iVar4 = 0;
  }
LAB_005c951a:
  *p_end = uVar5;
  return iVar4;
}

Assistant:

static int
md_line_contains(MD_CTX* ctx, OFF beg, const CHAR* what, SZ what_len, OFF* p_end)
{
    OFF i;
    for(i = beg; i + what_len < ctx->size; i++) {
        if(ISNEWLINE(i))
            break;
        if(memcmp(STR(i), what, what_len * sizeof(CHAR)) == 0) {
            *p_end = i + what_len;
            return TRUE;
        }
    }

    *p_end = i;
    return FALSE;
}